

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall
wallet::CWallet::CacheNewScriptPubKeys
          (CWallet *this,set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *spks,
          ScriptPubKeyMan *spkm)

{
  iterator __position;
  vector<wallet::ScriptPubKeyMan*,std::allocator<wallet::ScriptPubKeyMan*>> *this_00;
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  long in_FS_OFFSET;
  ScriptPubKeyMan *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = (spks->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(spks->_M_t)._M_impl.super__Rb_tree_header;
  local_30 = spkm;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      this_00 = (vector<wallet::ScriptPubKeyMan*,std::allocator<wallet::ScriptPubKeyMan*>> *)
                std::__detail::
                _Map_base<CScript,_std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_std::allocator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<CScript,_std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_std::allocator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_cached_spks,(key_type *)(p_Var1 + 1));
      __position._M_current = *(ScriptPubKeyMan ***)(this_00 + 8);
      if (__position._M_current == *(ScriptPubKeyMan ***)(this_00 + 0x10)) {
        std::vector<wallet::ScriptPubKeyMan*,std::allocator<wallet::ScriptPubKeyMan*>>::
        _M_realloc_insert<wallet::ScriptPubKeyMan*const&>(this_00,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::CacheNewScriptPubKeys(const std::set<CScript>& spks, ScriptPubKeyMan* spkm)
{
    for (const auto& script : spks) {
        m_cached_spks[script].push_back(spkm);
    }
}